

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O3

bool __thiscall DIS::SeesPdu::operator==(SeesPdu *this,SeesPdu *rhs)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  bool bVar5;
  bool bVar6;
  undefined4 in_ECX;
  undefined4 uVar7;
  pointer pPVar8;
  pointer pVVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  bVar5 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar6 = EntityID::operator==(&this->_orginatingEntityID,&rhs->_orginatingEntityID);
  uVar10._0_2_ = this->_infraredSignatureRepresentationIndex;
  uVar10._2_2_ = this->_acousticSignatureRepresentationIndex;
  uVar10._4_2_ = this->_radarCrossSectionSignatureRepresentationIndex;
  uVar10._6_2_ = this->_numberOfPropulsionSystems;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar10;
  uVar1 = rhs->_infraredSignatureRepresentationIndex;
  uVar2 = rhs->_acousticSignatureRepresentationIndex;
  uVar3 = rhs->_radarCrossSectionSignatureRepresentationIndex;
  uVar4 = rhs->_numberOfPropulsionSystems;
  auVar14._0_2_ = -(ushort)(uVar1 == (undefined2)uVar10);
  auVar14._2_2_ = -(ushort)(uVar2 == uVar10._2_2_);
  auVar14._4_2_ = -(ushort)(uVar3 == uVar10._4_2_);
  auVar14._6_2_ = -(ushort)(uVar4 == uVar10._6_2_);
  auVar14._8_2_ = 0xffff;
  auVar14._10_2_ = 0xffff;
  auVar14._12_2_ = 0xffff;
  auVar14._14_2_ = 0xffff;
  auVar12 = pshuflw(auVar12,auVar14,0x50);
  auVar13._0_4_ = auVar12._0_4_;
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar12._4_4_;
  auVar13._12_4_ = auVar12._4_4_;
  uVar7 = movmskpd(in_ECX,auVar13);
  bVar5 = (bool)(this->_radarCrossSectionSignatureRepresentationIndex ==
                 rhs->_radarCrossSectionSignatureRepresentationIndex & (byte)uVar7 >> 1 &
                (bVar6 && bVar5) & (byte)uVar7);
  pPVar8 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_propulsionSystemData).
      super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      bVar6 = PropulsionSystemData::operator==
                        ((PropulsionSystemData *)
                         ((long)&pPVar8->_vptr_PropulsionSystemData + lVar11),
                         (PropulsionSystemData *)
                         ((long)&((rhs->_propulsionSystemData).
                                  super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_PropulsionSystemData + lVar11));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar10 = uVar10 + 1;
      pPVar8 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < (ulong)((long)(this->_propulsionSystemData).
                                    super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 4))
    ;
  }
  pVVar9 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vectoringSystemData).
      super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar9) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      bVar6 = VectoringNozzleSystemData::operator==
                        ((VectoringNozzleSystemData *)
                         ((long)&pVVar9->_vptr_VectoringNozzleSystemData + lVar11),
                         (VectoringNozzleSystemData *)
                         ((long)&((rhs->_vectoringSystemData).
                                  super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_VectoringNozzleSystemData + lVar11));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar10 = uVar10 + 1;
      pVVar9 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < (ulong)((long)(this->_vectoringSystemData).
                                    super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 4))
    ;
  }
  return bVar5;
}

Assistant:

bool SeesPdu::operator ==(const SeesPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_orginatingEntityID == rhs._orginatingEntityID) ) ivarsEqual = false;
     if( ! (_infraredSignatureRepresentationIndex == rhs._infraredSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_acousticSignatureRepresentationIndex == rhs._acousticSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_radarCrossSectionSignatureRepresentationIndex == rhs._radarCrossSectionSignatureRepresentationIndex) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        if( ! ( _propulsionSystemData[idx] == rhs._propulsionSystemData[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        if( ! ( _vectoringSystemData[idx] == rhs._vectoringSystemData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }